

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeZeroObjVariablePS::execute
          (FreeZeroObjVariablePS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  uint *puVar2;
  pointer pDVar3;
  undefined8 uVar4;
  pointer pnVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  int32_t iVar13;
  undefined1 auVar14 [16];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  ulong *puVar20;
  pointer pnVar21;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar22;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar23;
  int *piVar24;
  VarStatus VVar25;
  long lVar26;
  uint uVar27;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar28;
  int iVar29;
  fpclass_type fVar30;
  long lVar31;
  cpp_dec_float<50U,_int,_void> *pcVar32;
  cpp_dec_float<50U,_int,_void> *pcVar33;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  uint local_39c;
  cpp_dec_float<50U,_int,_void> local_398;
  cpp_dec_float<50U,_int,_void> local_358;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_318;
  long local_310;
  cpp_dec_float<50U,_int,_void> local_308;
  cpp_dec_float<50U,_int,_void> local_2c8;
  cpp_dec_float<50U,_int,_void> local_288;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_250;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_248;
  _func_int **local_240;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_238;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_230;
  cpp_dec_float<50U,_int,_void> local_228;
  fpclass_type local_1e8;
  int32_t iStack_1e4;
  undefined8 uStack_1e0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1d0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_1c8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148 [4];
  uint local_138 [2];
  uint auStack_130 [2];
  uint local_128 [2];
  uint auStack_120 [2];
  uint local_118 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar16 = this->m_j;
  iVar29 = this->m_old_j;
  if (iVar16 != iVar29) {
    pnVar21 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar21[iVar29].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar21[iVar16].m_backend.data._M_elems + 8);
    uVar4 = *(undefined8 *)&pnVar21[iVar16].m_backend.data;
    uVar7 = *(undefined8 *)(pnVar21[iVar16].m_backend.data._M_elems + 2);
    puVar1 = pnVar21[iVar16].m_backend.data._M_elems + 4;
    uVar8 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar21[iVar29].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar8;
    *(undefined8 *)&pnVar21[iVar29].m_backend.data = uVar4;
    *(undefined8 *)(pnVar21[iVar29].m_backend.data._M_elems + 2) = uVar7;
    pnVar21[iVar29].m_backend.exp = pnVar21[iVar16].m_backend.exp;
    pnVar21[iVar29].m_backend.neg = pnVar21[iVar16].m_backend.neg;
    iVar13 = pnVar21[iVar16].m_backend.prec_elem;
    pnVar21[iVar29].m_backend.fpclass = pnVar21[iVar16].m_backend.fpclass;
    pnVar21[iVar29].m_backend.prec_elem = iVar13;
    iVar16 = this->m_j;
    pnVar21 = (r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar29 = this->m_old_j;
    *(undefined8 *)(pnVar21[iVar29].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar21[iVar16].m_backend.data._M_elems + 8);
    uVar4 = *(undefined8 *)&pnVar21[iVar16].m_backend.data;
    uVar7 = *(undefined8 *)(pnVar21[iVar16].m_backend.data._M_elems + 2);
    puVar1 = pnVar21[iVar16].m_backend.data._M_elems + 4;
    uVar8 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar21[iVar29].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar8;
    *(undefined8 *)&pnVar21[iVar29].m_backend.data = uVar4;
    *(undefined8 *)(pnVar21[iVar29].m_backend.data._M_elems + 2) = uVar7;
    pnVar21[iVar29].m_backend.exp = pnVar21[iVar16].m_backend.exp;
    pnVar21[iVar29].m_backend.neg = pnVar21[iVar16].m_backend.neg;
    iVar13 = pnVar21[iVar16].m_backend.prec_elem;
    pnVar21[iVar29].m_backend.fpclass = pnVar21[iVar16].m_backend.fpclass;
    pnVar21[iVar29].m_backend.prec_elem = iVar13;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  iVar16 = (this->m_col).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  if (0 < iVar16) {
    lVar17 = (long)(this->m_old_i - iVar16);
    lVar18 = lVar17 * 0xe + 0x1a;
    lVar26 = 0xe;
    lVar31 = 0;
    do {
      uVar27 = (((this->m_col).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem)->val).m_backend.data._M_elems[lVar26];
      pnVar21 = (s->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((pnVar21->m_backend).data._M_elems + lVar18 + -4) =
           *(undefined8 *)(pnVar21[(int)uVar27].m_backend.data._M_elems + 8);
      uVar4 = *(undefined8 *)&pnVar21[(int)uVar27].m_backend.data;
      uVar7 = *(undefined8 *)(pnVar21[(int)uVar27].m_backend.data._M_elems + 2);
      puVar1 = pnVar21[(int)uVar27].m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (pnVar21->m_backend).data._M_elems + lVar18 + -8;
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar8;
      puVar1 = (pnVar21->m_backend).data._M_elems + lVar18 + -0xc;
      *(undefined8 *)puVar1 = uVar4;
      *(undefined8 *)(puVar1 + 2) = uVar7;
      (pnVar21->m_backend).data._M_elems[lVar18 + -2] = pnVar21[(int)uVar27].m_backend.exp;
      *(bool *)((pnVar21->m_backend).data._M_elems + lVar18 + -1) =
           pnVar21[(int)uVar27].m_backend.neg;
      iVar13 = pnVar21[(int)uVar27].m_backend.prec_elem;
      puVar1 = (pnVar21->m_backend).data._M_elems + lVar18;
      puVar1[0] = pnVar21[(int)uVar27].m_backend.fpclass;
      puVar1[1] = iVar13;
      pnVar21 = (y->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((pnVar21->m_backend).data._M_elems + lVar18 + -4) =
           *(undefined8 *)(pnVar21[(int)uVar27].m_backend.data._M_elems + 8);
      uVar4 = *(undefined8 *)&pnVar21[(int)uVar27].m_backend.data;
      uVar7 = *(undefined8 *)(pnVar21[(int)uVar27].m_backend.data._M_elems + 2);
      puVar1 = pnVar21[(int)uVar27].m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (pnVar21->m_backend).data._M_elems + lVar18 + -8;
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar8;
      puVar1 = (pnVar21->m_backend).data._M_elems + lVar18 + -0xc;
      *(undefined8 *)puVar1 = uVar4;
      *(undefined8 *)(puVar1 + 2) = uVar7;
      (pnVar21->m_backend).data._M_elems[lVar18 + -2] = pnVar21[(int)uVar27].m_backend.exp;
      *(bool *)((pnVar21->m_backend).data._M_elems + lVar18 + -1) =
           pnVar21[(int)uVar27].m_backend.neg;
      iVar13 = pnVar21[(int)uVar27].m_backend.prec_elem;
      puVar1 = (pnVar21->m_backend).data._M_elems + lVar18;
      puVar1[0] = pnVar21[(int)uVar27].m_backend.fpclass;
      puVar1[1] = iVar13;
      rStatus->data[lVar17 + lVar31 + 1] = rStatus->data[(int)uVar27];
      lVar31 = lVar31 + 1;
      iVar16 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused;
      lVar26 = lVar26 + 0xf;
      lVar18 = lVar18 + 0xe;
    } while (lVar31 < iVar16);
  }
  local_1c8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  local_1c8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  local_1c8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  local_240 = (_func_int **)&PTR__DSVectorBase_003b2428;
  local_1c8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b2428;
  local_1c8.theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  iVar29 = 2;
  if (0 < iVar16) {
    iVar29 = iVar16;
  }
  local_318 = x;
  local_250 = cStatus;
  local_238 = r;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&local_1c8,iVar29);
  local_230 = s;
  local_1d0 = y;
  if (this->m_loFree == false) {
    ::soplex::infinity::__tls_init();
    puVar20 = (ulong *)__tls_get_addr(&PTR_003b4b70);
    local_308.fpclass = cpp_dec_float_finite;
    local_308.prec_elem = 10;
    local_308.data._M_elems._0_16_ = ZEXT816(0);
    local_308.data._M_elems[4] = 0;
    local_308.data._M_elems[5] = 0;
    local_308.data._M_elems._24_5_ = 0;
    local_308.data._M_elems[7]._1_3_ = 0;
    local_308.data._M_elems._32_5_ = 0;
    local_308.data._M_elems[9]._1_3_ = 0;
    local_308.exp = 0;
    local_308.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_308,(double)(*puVar20 ^ (ulong)DAT_00356350));
    if ((int)((ulong)((long)(this->m_rows).data.
                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_rows).data.
                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
      local_39c = 0xffffffff;
    }
    else {
      local_248 = &(this->m_lRhs).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_39c = 0xffffffff;
      lVar17 = 0;
      do {
        local_288.fpclass = cpp_dec_float_finite;
        local_288.prec_elem = 10;
        local_288.data._M_elems[0] = 0;
        local_288.data._M_elems[1] = 0;
        local_288.data._M_elems[2] = 0;
        local_288.data._M_elems[3] = 0;
        local_288.data._M_elems[4] = 0;
        local_288.data._M_elems[5] = 0;
        local_288.data._M_elems._24_5_ = 0;
        local_288.data._M_elems[7]._1_3_ = 0;
        local_288.data._M_elems[8] = 0;
        local_288.data._M_elems[9] = 0;
        local_288.exp = 0;
        local_288.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_288,0.0);
        pDVar3 = (this->m_rows).data.
                 super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar16 = pDVar3[lVar17].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        if (0 < iVar16) {
          lVar26 = 0;
          lVar18 = 0;
          do {
            pNVar23 = pDVar3[lVar17].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            iVar29 = *(int *)((long)(&pNVar23->val + 1) + lVar26);
            if (iVar29 != this->m_j) {
              pcVar12 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(pNVar23->val).m_backend.data._M_elems + lVar26);
              pcVar32 = &(local_318->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar29].m_backend;
              local_398.fpclass = cpp_dec_float_finite;
              local_398.prec_elem = 10;
              local_398.data._M_elems[0] = 0;
              local_398.data._M_elems[1] = 0;
              local_398.data._M_elems[2] = 0;
              local_398.data._M_elems[3] = 0;
              local_398.data._M_elems[4] = 0;
              local_398.data._M_elems[5] = 0;
              local_398.data._M_elems._24_5_ = 0;
              local_398.data._M_elems[7]._1_3_ = 0;
              local_398.data._M_elems._32_5_ = 0;
              local_398.data._M_elems[9]._1_3_ = 0;
              local_398.exp = 0;
              local_398.neg = false;
              pcVar33 = pcVar12;
              if ((&local_398 != pcVar32) && (pcVar33 = pcVar32, pcVar12 != &local_398)) {
                uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
                local_398.data._M_elems._32_5_ = SUB85(uVar4,0);
                local_398.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_398.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
                local_398.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
                local_398.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_398.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_398.exp = *(int *)((long)(&(pNVar23->val).m_backend.data + 1) + lVar26);
                local_398.neg = *(bool *)((long)(&(pNVar23->val).m_backend.data + 1) + lVar26 + 4);
                local_398._48_8_ =
                     *(undefined8 *)((long)(&(pNVar23->val).m_backend.data + 1) + lVar26 + 8);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_398,pcVar33);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_288,&local_398);
              iVar16 = pDVar3[lVar17].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
            }
            lVar18 = lVar18 + 1;
            lVar26 = lVar26 + 0x3c;
          } while (lVar18 < iVar16);
        }
        pSVar15 = local_248;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[](&local_110,local_248,(int)lVar17);
        auVar14 = (undefined1  [16])local_288.data._M_elems._0_16_;
        local_398.data._M_elems._32_5_ = local_110.m_backend.data._M_elems._32_5_;
        local_398.data._M_elems[9]._1_3_ = local_110.m_backend.data._M_elems[9]._1_3_;
        local_398.data._M_elems[4] = local_110.m_backend.data._M_elems[4];
        local_398.data._M_elems[5] = local_110.m_backend.data._M_elems[5];
        local_398.data._M_elems._24_5_ = local_110.m_backend.data._M_elems._24_5_;
        local_398.data._M_elems[7]._1_3_ = local_110.m_backend.data._M_elems[7]._1_3_;
        local_398.data._M_elems[0] = local_110.m_backend.data._M_elems[0];
        local_398.data._M_elems[1] = local_110.m_backend.data._M_elems[1];
        uVar4 = local_398.data._M_elems._0_8_;
        local_398.data._M_elems[0] = local_110.m_backend.data._M_elems[0];
        local_398.data._M_elems[1] = local_110.m_backend.data._M_elems[1];
        uVar7 = local_398.data._M_elems._0_8_;
        local_398.data._M_elems[2] = local_110.m_backend.data._M_elems[2];
        local_398.data._M_elems[3] = local_110.m_backend.data._M_elems[3];
        local_398.exp = local_110.m_backend.exp;
        local_398.neg = local_110.m_backend.neg;
        local_398.fpclass = local_110.m_backend.fpclass;
        local_398.prec_elem = local_110.m_backend.prec_elem;
        if ((local_110.m_backend.neg == true) &&
           (local_398.data._M_elems[0] = local_110.m_backend.data._M_elems[0],
           local_398.data._M_elems[0] != 0 || local_110.m_backend.fpclass != cpp_dec_float_finite))
        {
          local_398.neg = false;
        }
        local_358.data._M_elems[8] = local_288.data._M_elems[8];
        local_358.data._M_elems[9] = local_288.data._M_elems[9];
        uVar8._5_3_ = local_288.data._M_elems[7]._1_3_;
        uVar8._0_5_ = local_288.data._M_elems._24_5_;
        local_358.data._M_elems[4] = local_288.data._M_elems[4];
        local_358.data._M_elems[5] = local_288.data._M_elems[5];
        local_358.data._M_elems[6] = local_288.data._M_elems[6];
        local_358.data._M_elems[7] = SUB84(uVar8,4);
        local_358.data._M_elems[0] = local_288.data._M_elems[0];
        local_358.data._M_elems[1] = local_288.data._M_elems[1];
        uVar8 = local_358.data._M_elems._0_8_;
        local_358.data._M_elems[2] = local_288.data._M_elems[2];
        local_358.data._M_elems[3] = local_288.data._M_elems[3];
        local_358.exp = local_288.exp;
        local_358.neg = local_288.neg;
        local_358.fpclass = local_288.fpclass;
        local_358.prec_elem = local_288.prec_elem;
        fVar30 = local_288.fpclass;
        if ((local_288.neg != false) &&
           (local_358.data._M_elems[0] = auVar14._0_4_,
           fVar30 != cpp_dec_float_finite || local_358.data._M_elems[0] != 0)) {
          local_358.neg = (bool)(local_288.neg ^ 1);
        }
        local_358.data._M_elems._0_8_ = uVar8;
        local_288.data._M_elems._0_16_ = auVar14;
        local_398.data._M_elems._0_8_ = uVar4;
        if (fVar30 == cpp_dec_float_NaN || local_110.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0032920e:
          local_2c8.data._M_elems[8] = local_358.data._M_elems[8];
          local_2c8.data._M_elems[9] = local_358.data._M_elems[9];
          local_2c8.data._M_elems[4] = local_358.data._M_elems[4];
          local_2c8.data._M_elems[5] = local_358.data._M_elems[5];
          local_2c8.data._M_elems[6] = local_358.data._M_elems[6];
          local_2c8.data._M_elems[7] = local_358.data._M_elems[7];
          local_2c8.data._M_elems[0] = local_358.data._M_elems[0];
          local_2c8.data._M_elems[1] = local_358.data._M_elems[1];
          local_2c8.data._M_elems[2] = local_358.data._M_elems[2];
          local_2c8.data._M_elems[3] = local_358.data._M_elems[3];
          local_2c8.exp = local_358.exp;
          local_2c8.neg = local_358.neg;
          pcVar12 = &local_358;
        }
        else {
          local_398.data._M_elems._0_8_ = uVar7;
          iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_398,&local_358);
          if (iVar16 < 1) {
            fVar30 = local_358.fpclass;
            goto LAB_0032920e;
          }
          uVar7._5_3_ = local_398.data._M_elems[9]._1_3_;
          uVar7._0_5_ = local_398.data._M_elems._32_5_;
          local_2c8.data._M_elems[8] = local_398.data._M_elems[8];
          local_2c8.data._M_elems[9] = SUB84(uVar7,4);
          uVar4._5_3_ = local_398.data._M_elems[7]._1_3_;
          uVar4._0_5_ = local_398.data._M_elems._24_5_;
          local_2c8.data._M_elems[4] = local_398.data._M_elems[4];
          local_2c8.data._M_elems[5] = local_398.data._M_elems[5];
          local_2c8.data._M_elems[6] = local_398.data._M_elems[6];
          local_2c8.data._M_elems[7] = SUB84(uVar4,4);
          local_2c8.data._M_elems[0] = local_398.data._M_elems[0];
          local_2c8.data._M_elems[1] = local_398.data._M_elems[1];
          local_2c8.data._M_elems[2] = local_398.data._M_elems[2];
          local_2c8.data._M_elems[3] = local_398.data._M_elems[3];
          local_2c8.exp = local_398.exp;
          local_2c8.neg = local_398.neg;
          pcVar12 = &local_398;
          fVar30 = local_398.fpclass;
        }
        local_2c8.fpclass = fVar30;
        local_2c8.prec_elem = pcVar12->prec_elem;
        local_310 = lVar17;
        if (fVar30 != cpp_dec_float_NaN) {
          local_398.fpclass = cpp_dec_float_finite;
          local_398.prec_elem = 10;
          local_398.data._M_elems[0] = 0;
          local_398.data._M_elems[1] = 0;
          local_398.data._M_elems[2] = 0;
          local_398.data._M_elems[3] = 0;
          local_398.data._M_elems[4] = 0;
          local_398.data._M_elems[5] = 0;
          local_398.data._M_elems._24_5_ = 0;
          local_398.data._M_elems[7]._1_3_ = 0;
          local_398.data._M_elems._32_5_ = 0;
          local_398.data._M_elems[9]._1_3_ = 0;
          local_398.exp = 0;
          local_398.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_398,1.0);
          iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_2c8,&local_398);
          if (iVar16 < 0) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_2c8,1.0);
          }
        }
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_228,pSVar15,(int)local_310);
        local_398.fpclass = cpp_dec_float_finite;
        local_398.prec_elem = 10;
        local_398.data._M_elems._0_16_ = ZEXT816(0);
        local_398.data._M_elems[4] = 0;
        local_398.data._M_elems[5] = 0;
        local_398.data._M_elems._24_5_ = 0;
        local_398.data._M_elems[7]._1_3_ = 0;
        local_398.data._M_elems._32_5_ = 0;
        local_398.data._M_elems[9]._1_3_ = 0;
        local_398.exp = 0;
        local_398.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_398,&local_228,&local_2c8);
        local_1a8.fpclass = cpp_dec_float_finite;
        local_1a8.prec_elem = 10;
        local_1a8.data._M_elems[0] = 0;
        local_1a8.data._M_elems[1] = 0;
        local_1a8.data._M_elems[2] = 0;
        local_1a8.data._M_elems[3] = 0;
        local_1a8.data._M_elems[4] = 0;
        local_1a8.data._M_elems[5] = 0;
        local_1a8.data._M_elems._24_5_ = 0;
        local_1a8.data._M_elems[7]._1_3_ = 0;
        local_1a8.data._M_elems._32_5_ = 0;
        local_1a8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1a8,&local_288,&local_2c8);
        auVar14 = (undefined1  [16])local_398.data._M_elems._0_16_;
        local_358.data._M_elems[9]._1_3_ = local_398.data._M_elems[9]._1_3_;
        local_358.data._M_elems._32_5_ = local_398.data._M_elems._32_5_;
        local_358.data._M_elems[7]._1_3_ = local_398.data._M_elems[7]._1_3_;
        local_358.data._M_elems._24_5_ = local_398.data._M_elems._24_5_;
        local_358.data._M_elems[4] = local_398.data._M_elems[4];
        local_358.data._M_elems[5] = local_398.data._M_elems[5];
        local_358.data._M_elems[0] = local_398.data._M_elems[0];
        local_358.data._M_elems[1] = local_398.data._M_elems[1];
        local_358.data._M_elems[2] = local_398.data._M_elems[2];
        local_358.data._M_elems[3] = local_398.data._M_elems[3];
        local_358.exp = local_398.exp;
        local_358.neg = local_398.neg;
        local_358.fpclass = local_398.fpclass;
        local_358.prec_elem = local_398.prec_elem;
        local_398.data._M_elems._0_16_ = auVar14;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_358,&local_1a8);
        bVar6 = local_358.neg;
        iVar16 = local_358.exp;
        local_168[0] = local_358.data._M_elems[0];
        local_168[1] = local_358.data._M_elems[1];
        auStack_160[0] = local_358.data._M_elems[2];
        auStack_160[1] = local_358.data._M_elems[3];
        local_158[0] = local_358.data._M_elems[4];
        local_158[1] = local_358.data._M_elems[5];
        auStack_150[0] = local_358.data._M_elems[6];
        auStack_150[1] = local_358.data._M_elems[7];
        local_148[0] = local_358.data._M_elems[8];
        local_148[1] = local_358.data._M_elems[9];
        local_1e8 = local_358.fpclass;
        iStack_1e4 = local_358.prec_elem;
        uStack_1e0 = 0;
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_a0,this);
        local_398.data._M_elems._32_5_ = SUB85(local_148._0_8_,0);
        local_398.data._M_elems[9]._1_3_ = SUB83(local_148._0_8_,5);
        local_398.data._M_elems[4] = local_158[0];
        local_398.data._M_elems[5] = local_158[1];
        local_398.data._M_elems._24_5_ = auStack_150._0_5_;
        local_398.data._M_elems[7]._1_3_ = auStack_150[1]._1_3_;
        local_398.data._M_elems[2] = auStack_160[0];
        local_398.data._M_elems[3] = auStack_160[1];
        local_398.data._M_elems[0] = local_168[0];
        local_398.data._M_elems[1] = local_168[1];
        auVar14 = (undefined1  [16])local_398.data._M_elems._0_16_;
        local_398.exp = iVar16;
        local_398.neg = bVar6;
        fVar30 = local_1e8;
        local_398.fpclass = local_1e8;
        local_398.prec_elem = iStack_1e4;
        if ((bVar6 != false) &&
           (local_398.data._M_elems[0] = local_168[0],
           local_398.data._M_elems[0] != 0 || fVar30 != cpp_dec_float_finite)) {
          local_398.neg = (bool)(bVar6 ^ 1);
        }
        local_398.data._M_elems._0_16_ = auVar14;
        if (((fVar30 != cpp_dec_float_NaN) && (local_a0.fpclass != cpp_dec_float_NaN)) &&
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_398,&local_a0), iVar16 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_358,0.0);
        }
        local_228.data._M_elems[8] = local_358.data._M_elems[8];
        local_228.data._M_elems[9] = local_358.data._M_elems[9];
        local_228.data._M_elems[4] = local_358.data._M_elems[4];
        local_228.data._M_elems[5] = local_358.data._M_elems[5];
        local_228.data._M_elems[6] = local_358.data._M_elems[6];
        local_228.data._M_elems[7] = local_358.data._M_elems[7];
        local_228.data._M_elems[0] = local_358.data._M_elems[0];
        local_228.data._M_elems[1] = local_358.data._M_elems[1];
        local_228.data._M_elems[2] = local_358.data._M_elems[2];
        local_228.data._M_elems[3] = local_358.data._M_elems[3];
        local_228.exp = local_358.exp;
        local_228.neg = local_358.neg;
        local_228.fpclass = local_358.fpclass;
        local_228.prec_elem = local_358.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_228,&local_2c8);
        s = local_230;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1a8,
                     &pDVar3[lVar17].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,this->m_j);
        local_398.fpclass = cpp_dec_float_finite;
        local_398.prec_elem = 10;
        local_398.data._M_elems[0] = 0;
        local_398.data._M_elems[1] = 0;
        local_398.data._M_elems[2] = 0;
        local_398.data._M_elems[3] = 0;
        local_398.data._M_elems[4] = 0;
        local_398.data._M_elems[5] = 0;
        local_398.data._M_elems._24_5_ = 0;
        local_398.data._M_elems[7]._1_3_ = 0;
        local_398.data._M_elems._32_5_ = 0;
        local_398.data._M_elems[9]._1_3_ = 0;
        local_398.exp = 0;
        local_398.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_398,&local_228,&local_1a8);
        lVar17 = local_310;
        uVar27 = (uint)local_310;
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&local_1c8,uVar27,
              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_288);
        if (((local_398.fpclass != cpp_dec_float_NaN) && (local_308.fpclass != cpp_dec_float_NaN))
           && (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_398,&local_308), 0 < iVar16)) {
          local_308.data._M_elems._32_5_ = local_398.data._M_elems._32_5_;
          local_308.data._M_elems[9]._1_3_ = local_398.data._M_elems[9]._1_3_;
          local_308.data._M_elems[4] = local_398.data._M_elems[4];
          local_308.data._M_elems[5] = local_398.data._M_elems[5];
          local_308.data._M_elems._24_5_ = local_398.data._M_elems._24_5_;
          local_308.data._M_elems[7]._1_3_ = local_398.data._M_elems[7]._1_3_;
          local_308.data._M_elems[0] = local_398.data._M_elems[0];
          local_308.data._M_elems[1] = local_398.data._M_elems[1];
          local_308.data._M_elems[2] = local_398.data._M_elems[2];
          local_308.data._M_elems[3] = local_398.data._M_elems[3];
          local_308.exp = local_398.exp;
          local_308.neg = local_398.neg;
          local_308.fpclass = local_398.fpclass;
          local_308.prec_elem = local_398.prec_elem;
          local_39c = uVar27;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < (int)((ulong)((long)(this->m_rows).data.
                                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_rows).data.
                                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    if ((((this->m_bnd).m_backend.fpclass != cpp_dec_float_NaN) &&
        (local_308.fpclass != cpp_dec_float_NaN)) &&
       (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&(this->m_bnd).m_backend,&local_308), 0 < iVar16)) goto LAB_00329659;
  }
  else {
    ::soplex::infinity::__tls_init();
    pdVar19 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_308.fpclass = cpp_dec_float_finite;
    local_308.prec_elem = 10;
    local_308.data._M_elems._0_16_ = ZEXT816(0);
    local_308.data._M_elems[4] = 0;
    local_308.data._M_elems[5] = 0;
    local_308.data._M_elems._24_5_ = 0;
    local_308.data._M_elems[7]._1_3_ = 0;
    local_308.data._M_elems._32_5_ = 0;
    local_308.data._M_elems[9]._1_3_ = 0;
    local_308.exp = 0;
    local_308.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_308,*pdVar19);
    if ((int)((ulong)((long)(this->m_rows).data.
                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_rows).data.
                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
      local_39c = 0xffffffff;
    }
    else {
      local_248 = &(this->m_lRhs).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_39c = 0xffffffff;
      lVar17 = 0;
      do {
        local_288.fpclass = cpp_dec_float_finite;
        local_288.prec_elem = 10;
        local_288.data._M_elems[0] = 0;
        local_288.data._M_elems[1] = 0;
        local_288.data._M_elems[2] = 0;
        local_288.data._M_elems[3] = 0;
        local_288.data._M_elems[4] = 0;
        local_288.data._M_elems[5] = 0;
        local_288.data._M_elems._24_5_ = 0;
        local_288.data._M_elems[7]._1_3_ = 0;
        local_288.data._M_elems[8] = 0;
        local_288.data._M_elems[9] = 0;
        local_288.exp = 0;
        local_288.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_288,0.0);
        pDVar3 = (this->m_rows).data.
                 super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar16 = pDVar3[lVar17].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        if (0 < iVar16) {
          lVar26 = 0;
          lVar18 = 0;
          do {
            pNVar23 = pDVar3[lVar17].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            iVar29 = *(int *)((long)(&pNVar23->val + 1) + lVar26);
            if (iVar29 != this->m_j) {
              pcVar12 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(pNVar23->val).m_backend.data._M_elems + lVar26);
              pcVar32 = &(local_318->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar29].m_backend;
              local_398.fpclass = cpp_dec_float_finite;
              local_398.prec_elem = 10;
              local_398.data._M_elems[0] = 0;
              local_398.data._M_elems[1] = 0;
              local_398.data._M_elems[2] = 0;
              local_398.data._M_elems[3] = 0;
              local_398.data._M_elems[4] = 0;
              local_398.data._M_elems[5] = 0;
              local_398.data._M_elems._24_5_ = 0;
              local_398.data._M_elems[7]._1_3_ = 0;
              local_398.data._M_elems._32_5_ = 0;
              local_398.data._M_elems[9]._1_3_ = 0;
              local_398.exp = 0;
              local_398.neg = false;
              pcVar33 = pcVar12;
              if ((&local_398 != pcVar32) && (pcVar33 = pcVar32, pcVar12 != &local_398)) {
                uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
                local_398.data._M_elems._32_5_ = SUB85(uVar4,0);
                local_398.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_398.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
                local_398.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
                local_398.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_398.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_398.exp = *(int *)((long)(&(pNVar23->val).m_backend.data + 1) + lVar26);
                local_398.neg = *(bool *)((long)(&(pNVar23->val).m_backend.data + 1) + lVar26 + 4);
                local_398._48_8_ =
                     *(undefined8 *)((long)(&(pNVar23->val).m_backend.data + 1) + lVar26 + 8);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_398,pcVar33);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_288,&local_398);
              iVar16 = pDVar3[lVar17].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
            }
            lVar18 = lVar18 + 1;
            lVar26 = lVar26 + 0x3c;
          } while (lVar18 < iVar16);
        }
        pSVar15 = local_248;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[](&local_d8,local_248,(int)lVar17);
        auVar14 = (undefined1  [16])local_288.data._M_elems._0_16_;
        local_398.data._M_elems._32_5_ = local_d8.m_backend.data._M_elems._32_5_;
        local_398.data._M_elems[9]._1_3_ = local_d8.m_backend.data._M_elems[9]._1_3_;
        local_398.data._M_elems[4] = local_d8.m_backend.data._M_elems[4];
        local_398.data._M_elems[5] = local_d8.m_backend.data._M_elems[5];
        local_398.data._M_elems._24_5_ = local_d8.m_backend.data._M_elems._24_5_;
        local_398.data._M_elems[7]._1_3_ = local_d8.m_backend.data._M_elems[7]._1_3_;
        local_398.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
        local_398.data._M_elems[1] = local_d8.m_backend.data._M_elems[1];
        uVar4 = local_398.data._M_elems._0_8_;
        local_398.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
        local_398.data._M_elems[1] = local_d8.m_backend.data._M_elems[1];
        uVar7 = local_398.data._M_elems._0_8_;
        local_398.data._M_elems[2] = local_d8.m_backend.data._M_elems[2];
        local_398.data._M_elems[3] = local_d8.m_backend.data._M_elems[3];
        local_398.exp = local_d8.m_backend.exp;
        local_398.neg = local_d8.m_backend.neg;
        local_398.fpclass = local_d8.m_backend.fpclass;
        local_398.prec_elem = local_d8.m_backend.prec_elem;
        if ((local_d8.m_backend.neg == true) &&
           (local_398.data._M_elems[0] = local_d8.m_backend.data._M_elems[0],
           local_398.data._M_elems[0] != 0 || local_d8.m_backend.fpclass != cpp_dec_float_finite)) {
          local_398.neg = false;
        }
        local_358.data._M_elems[8] = local_288.data._M_elems[8];
        local_358.data._M_elems[9] = local_288.data._M_elems[9];
        uVar11._5_3_ = local_288.data._M_elems[7]._1_3_;
        uVar11._0_5_ = local_288.data._M_elems._24_5_;
        local_358.data._M_elems[4] = local_288.data._M_elems[4];
        local_358.data._M_elems[5] = local_288.data._M_elems[5];
        local_358.data._M_elems[6] = local_288.data._M_elems[6];
        local_358.data._M_elems[7] = SUB84(uVar11,4);
        local_358.data._M_elems[0] = local_288.data._M_elems[0];
        local_358.data._M_elems[1] = local_288.data._M_elems[1];
        uVar8 = local_358.data._M_elems._0_8_;
        local_358.data._M_elems[2] = local_288.data._M_elems[2];
        local_358.data._M_elems[3] = local_288.data._M_elems[3];
        local_358.exp = local_288.exp;
        local_358.neg = local_288.neg;
        local_358.fpclass = local_288.fpclass;
        local_358.prec_elem = local_288.prec_elem;
        fVar30 = local_288.fpclass;
        if ((local_288.neg != false) &&
           (local_358.data._M_elems[0] = auVar14._0_4_,
           fVar30 != cpp_dec_float_finite || local_358.data._M_elems[0] != 0)) {
          local_358.neg = (bool)(local_288.neg ^ 1);
        }
        local_358.data._M_elems._0_8_ = uVar8;
        local_288.data._M_elems._0_16_ = auVar14;
        local_398.data._M_elems._0_8_ = uVar4;
        if (fVar30 == cpp_dec_float_NaN || local_d8.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00328ae6:
          local_2c8.data._M_elems[8] = local_358.data._M_elems[8];
          local_2c8.data._M_elems[9] = local_358.data._M_elems[9];
          local_2c8.data._M_elems[4] = local_358.data._M_elems[4];
          local_2c8.data._M_elems[5] = local_358.data._M_elems[5];
          local_2c8.data._M_elems[6] = local_358.data._M_elems[6];
          local_2c8.data._M_elems[7] = local_358.data._M_elems[7];
          local_2c8.data._M_elems[0] = local_358.data._M_elems[0];
          local_2c8.data._M_elems[1] = local_358.data._M_elems[1];
          local_2c8.data._M_elems[2] = local_358.data._M_elems[2];
          local_2c8.data._M_elems[3] = local_358.data._M_elems[3];
          local_2c8.exp = local_358.exp;
          local_2c8.neg = local_358.neg;
          pcVar12 = &local_358;
        }
        else {
          local_398.data._M_elems._0_8_ = uVar7;
          iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_398,&local_358);
          if (iVar16 < 1) {
            fVar30 = local_358.fpclass;
            goto LAB_00328ae6;
          }
          uVar10._5_3_ = local_398.data._M_elems[9]._1_3_;
          uVar10._0_5_ = local_398.data._M_elems._32_5_;
          local_2c8.data._M_elems[8] = local_398.data._M_elems[8];
          local_2c8.data._M_elems[9] = SUB84(uVar10,4);
          uVar9._5_3_ = local_398.data._M_elems[7]._1_3_;
          uVar9._0_5_ = local_398.data._M_elems._24_5_;
          local_2c8.data._M_elems[4] = local_398.data._M_elems[4];
          local_2c8.data._M_elems[5] = local_398.data._M_elems[5];
          local_2c8.data._M_elems[6] = local_398.data._M_elems[6];
          local_2c8.data._M_elems[7] = SUB84(uVar9,4);
          local_2c8.data._M_elems[0] = local_398.data._M_elems[0];
          local_2c8.data._M_elems[1] = local_398.data._M_elems[1];
          local_2c8.data._M_elems[2] = local_398.data._M_elems[2];
          local_2c8.data._M_elems[3] = local_398.data._M_elems[3];
          local_2c8.exp = local_398.exp;
          local_2c8.neg = local_398.neg;
          pcVar12 = &local_398;
          fVar30 = local_398.fpclass;
        }
        local_2c8.fpclass = fVar30;
        local_2c8.prec_elem = pcVar12->prec_elem;
        local_310 = lVar17;
        if (fVar30 != cpp_dec_float_NaN) {
          local_398.fpclass = cpp_dec_float_finite;
          local_398.prec_elem = 10;
          local_398.data._M_elems[0] = 0;
          local_398.data._M_elems[1] = 0;
          local_398.data._M_elems[2] = 0;
          local_398.data._M_elems[3] = 0;
          local_398.data._M_elems[4] = 0;
          local_398.data._M_elems[5] = 0;
          local_398.data._M_elems._24_5_ = 0;
          local_398.data._M_elems[7]._1_3_ = 0;
          local_398.data._M_elems._32_5_ = 0;
          local_398.data._M_elems[9]._1_3_ = 0;
          local_398.exp = 0;
          local_398.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_398,1.0);
          iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_2c8,&local_398);
          if (iVar16 < 0) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_2c8,1.0);
          }
        }
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_228,pSVar15,(int)local_310);
        local_398.fpclass = cpp_dec_float_finite;
        local_398.prec_elem = 10;
        local_398.data._M_elems._0_16_ = ZEXT816(0);
        local_398.data._M_elems[4] = 0;
        local_398.data._M_elems[5] = 0;
        local_398.data._M_elems._24_5_ = 0;
        local_398.data._M_elems[7]._1_3_ = 0;
        local_398.data._M_elems._32_5_ = 0;
        local_398.data._M_elems[9]._1_3_ = 0;
        local_398.exp = 0;
        local_398.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_398,&local_228,&local_2c8);
        local_1a8.fpclass = cpp_dec_float_finite;
        local_1a8.prec_elem = 10;
        local_1a8.data._M_elems[0] = 0;
        local_1a8.data._M_elems[1] = 0;
        local_1a8.data._M_elems[2] = 0;
        local_1a8.data._M_elems[3] = 0;
        local_1a8.data._M_elems[4] = 0;
        local_1a8.data._M_elems[5] = 0;
        local_1a8.data._M_elems._24_5_ = 0;
        local_1a8.data._M_elems[7]._1_3_ = 0;
        local_1a8.data._M_elems._32_5_ = 0;
        local_1a8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1a8,&local_288,&local_2c8);
        auVar14 = (undefined1  [16])local_398.data._M_elems._0_16_;
        local_358.data._M_elems[9]._1_3_ = local_398.data._M_elems[9]._1_3_;
        local_358.data._M_elems._32_5_ = local_398.data._M_elems._32_5_;
        local_358.data._M_elems[7]._1_3_ = local_398.data._M_elems[7]._1_3_;
        local_358.data._M_elems._24_5_ = local_398.data._M_elems._24_5_;
        local_358.data._M_elems[4] = local_398.data._M_elems[4];
        local_358.data._M_elems[5] = local_398.data._M_elems[5];
        local_358.data._M_elems[0] = local_398.data._M_elems[0];
        local_358.data._M_elems[1] = local_398.data._M_elems[1];
        local_358.data._M_elems[2] = local_398.data._M_elems[2];
        local_358.data._M_elems[3] = local_398.data._M_elems[3];
        local_358.exp = local_398.exp;
        local_358.neg = local_398.neg;
        local_358.fpclass = local_398.fpclass;
        local_358.prec_elem = local_398.prec_elem;
        local_398.data._M_elems._0_16_ = auVar14;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_358,&local_1a8);
        bVar6 = local_358.neg;
        iVar16 = local_358.exp;
        local_138[0] = local_358.data._M_elems[0];
        local_138[1] = local_358.data._M_elems[1];
        auStack_130[0] = local_358.data._M_elems[2];
        auStack_130[1] = local_358.data._M_elems[3];
        local_128[0] = local_358.data._M_elems[4];
        local_128[1] = local_358.data._M_elems[5];
        auStack_120[0] = local_358.data._M_elems[6];
        auStack_120[1] = local_358.data._M_elems[7];
        local_118[0] = local_358.data._M_elems[8];
        local_118[1] = local_358.data._M_elems[9];
        local_1e8 = local_358.fpclass;
        iStack_1e4 = local_358.prec_elem;
        uStack_1e0 = 0;
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_68,this);
        local_398.data._M_elems._32_5_ = local_118._0_5_;
        local_398.data._M_elems[9]._1_3_ = local_118[1]._1_3_;
        local_398.data._M_elems[4] = local_128[0];
        local_398.data._M_elems[5] = local_128[1];
        local_398.data._M_elems._24_5_ = auStack_120._0_5_;
        local_398.data._M_elems[7]._1_3_ = auStack_120[1]._1_3_;
        local_398.data._M_elems[2] = auStack_130[0];
        local_398.data._M_elems[3] = auStack_130[1];
        local_398.data._M_elems[0] = local_138[0];
        local_398.data._M_elems[1] = local_138[1];
        auVar14 = (undefined1  [16])local_398.data._M_elems._0_16_;
        local_398.exp = iVar16;
        local_398.neg = bVar6;
        fVar30 = local_1e8;
        local_398.fpclass = local_1e8;
        local_398.prec_elem = iStack_1e4;
        if ((bVar6 != false) &&
           (local_398.data._M_elems[0] = local_138[0],
           local_398.data._M_elems[0] != 0 || fVar30 != cpp_dec_float_finite)) {
          local_398.neg = (bool)(bVar6 ^ 1);
        }
        local_398.data._M_elems._0_16_ = auVar14;
        if (((fVar30 != cpp_dec_float_NaN) && (local_68.fpclass != cpp_dec_float_NaN)) &&
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_398,&local_68), iVar16 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_358,0.0);
        }
        local_228.data._M_elems[8] = local_358.data._M_elems[8];
        local_228.data._M_elems[9] = local_358.data._M_elems[9];
        local_228.data._M_elems[4] = local_358.data._M_elems[4];
        local_228.data._M_elems[5] = local_358.data._M_elems[5];
        local_228.data._M_elems[6] = local_358.data._M_elems[6];
        local_228.data._M_elems[7] = local_358.data._M_elems[7];
        local_228.data._M_elems[0] = local_358.data._M_elems[0];
        local_228.data._M_elems[1] = local_358.data._M_elems[1];
        local_228.data._M_elems[2] = local_358.data._M_elems[2];
        local_228.data._M_elems[3] = local_358.data._M_elems[3];
        local_228.exp = local_358.exp;
        local_228.neg = local_358.neg;
        local_228.fpclass = local_358.fpclass;
        local_228.prec_elem = local_358.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_228,&local_2c8);
        s = local_230;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1a8,
                     &pDVar3[lVar17].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,this->m_j);
        local_398.fpclass = cpp_dec_float_finite;
        local_398.prec_elem = 10;
        local_398.data._M_elems[0] = 0;
        local_398.data._M_elems[1] = 0;
        local_398.data._M_elems[2] = 0;
        local_398.data._M_elems[3] = 0;
        local_398.data._M_elems[4] = 0;
        local_398.data._M_elems[5] = 0;
        local_398.data._M_elems._24_5_ = 0;
        local_398.data._M_elems[7]._1_3_ = 0;
        local_398.data._M_elems._32_5_ = 0;
        local_398.data._M_elems[9]._1_3_ = 0;
        local_398.exp = 0;
        local_398.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_398,&local_228,&local_1a8);
        lVar17 = local_310;
        uVar27 = (uint)local_310;
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&local_1c8,uVar27,
              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_288);
        if (((local_398.fpclass != cpp_dec_float_NaN) && (local_308.fpclass != cpp_dec_float_NaN))
           && (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_398,&local_308), iVar16 < 0)) {
          local_308.data._M_elems._32_5_ = local_398.data._M_elems._32_5_;
          local_308.data._M_elems[9]._1_3_ = local_398.data._M_elems[9]._1_3_;
          local_308.data._M_elems[4] = local_398.data._M_elems[4];
          local_308.data._M_elems[5] = local_398.data._M_elems[5];
          local_308.data._M_elems._24_5_ = local_398.data._M_elems._24_5_;
          local_308.data._M_elems[7]._1_3_ = local_398.data._M_elems[7]._1_3_;
          local_308.data._M_elems[0] = local_398.data._M_elems[0];
          local_308.data._M_elems[1] = local_398.data._M_elems[1];
          local_308.data._M_elems[2] = local_398.data._M_elems[2];
          local_308.data._M_elems[3] = local_398.data._M_elems[3];
          local_308.exp = local_398.exp;
          local_308.neg = local_398.neg;
          local_308.fpclass = local_398.fpclass;
          local_308.prec_elem = local_398.prec_elem;
          local_39c = uVar27;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < (int)((ulong)((long)(this->m_rows).data.
                                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_rows).data.
                                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    if ((((this->m_bnd).m_backend.fpclass != cpp_dec_float_NaN) &&
        (local_308.fpclass != cpp_dec_float_NaN)) &&
       (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&(this->m_bnd).m_backend,&local_308), iVar16 < 0)) {
LAB_00329659:
      iVar16 = this->m_j;
      pnVar5 = (local_318->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar21 = pnVar5 + iVar16;
      *(undefined8 *)(pnVar5[iVar16].m_backend.data._M_elems + 8) =
           *(undefined8 *)((this->m_bnd).m_backend.data._M_elems + 8);
      uVar4 = *(undefined8 *)(this->m_bnd).m_backend.data._M_elems;
      uVar7 = *(undefined8 *)((this->m_bnd).m_backend.data._M_elems + 2);
      uVar8 = *(undefined8 *)((this->m_bnd).m_backend.data._M_elems + 6);
      puVar1 = pnVar5[iVar16].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = *(undefined8 *)((this->m_bnd).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar1 + 2) = uVar8;
      *(undefined8 *)&pnVar5[iVar16].m_backend.data = uVar4;
      *(undefined8 *)(pnVar5[iVar16].m_backend.data._M_elems + 2) = uVar7;
      pnVar5[iVar16].m_backend.exp = (this->m_bnd).m_backend.exp;
      pnVar5[iVar16].m_backend.neg = (this->m_bnd).m_backend.neg;
      pnVar5[iVar16].m_backend.fpclass = (this->m_bnd).m_backend.fpclass;
      pcVar12 = &(this->m_bnd).m_backend;
      local_39c = 0xffffffff;
      goto LAB_00329704;
    }
  }
  pcVar12 = &local_308;
  iVar16 = this->m_j;
  pnVar5 = (local_318->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar21 = pnVar5 + iVar16;
  *(ulong *)(pnVar5[iVar16].m_backend.data._M_elems + 8) =
       CONCAT35(local_308.data._M_elems[9]._1_3_,local_308.data._M_elems._32_5_);
  puVar1 = pnVar5[iVar16].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_308.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_308.data._M_elems[7]._1_3_,local_308.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar5[iVar16].m_backend.data = local_308.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar16].m_backend.data._M_elems + 2) = local_308.data._M_elems._8_8_;
  pnVar5[iVar16].m_backend.exp = local_308.exp;
  pnVar5[iVar16].m_backend.neg = local_308.neg;
  pnVar5[iVar16].m_backend.fpclass = local_308.fpclass;
LAB_00329704:
  (pnVar21->m_backend).prec_elem = pcVar12->prec_elem;
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar18 = 0;
    lVar17 = 0;
    do {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_358,
                   &local_1c8.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,(int)lVar17);
      pNVar23 = (this->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      pcVar12 = (cpp_dec_float<50U,_int,_void> *)
                ((long)(pNVar23->val).m_backend.data._M_elems + lVar18);
      pcVar32 = &(local_318->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
      local_308.fpclass = cpp_dec_float_finite;
      local_308.prec_elem = 10;
      local_308.data._M_elems[0] = 0;
      local_308.data._M_elems[1] = 0;
      local_308.data._M_elems[2] = 0;
      local_308.data._M_elems[3] = 0;
      local_308.data._M_elems[4] = 0;
      local_308.data._M_elems[5] = 0;
      local_308.data._M_elems._24_5_ = 0;
      local_308.data._M_elems[7]._1_3_ = 0;
      local_308.data._M_elems._32_5_ = 0;
      local_308.data._M_elems[9]._1_3_ = 0;
      local_308.exp = 0;
      local_308.neg = false;
      pcVar33 = pcVar12;
      if ((&local_308 != pcVar32) && (pcVar33 = pcVar32, pcVar12 != &local_308)) {
        uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
        local_308.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_308.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_308.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
        local_308.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
        uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
        local_308.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_308.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_308.exp = *(int *)((long)(&(pNVar23->val).m_backend.data + 1) + lVar18);
        local_308.neg = *(bool *)((long)(&(pNVar23->val).m_backend.data + 1) + lVar18 + 4);
        local_308._48_8_ = *(undefined8 *)((long)(&(pNVar23->val).m_backend.data + 1) + lVar18 + 8);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_308,pcVar33)
      ;
      local_398.data._M_elems._32_5_ = local_358.data._M_elems._32_5_;
      local_398.data._M_elems[9]._1_3_ = local_358.data._M_elems[9]._1_3_;
      local_398.data._M_elems[4] = local_358.data._M_elems[4];
      local_398.data._M_elems[5] = local_358.data._M_elems[5];
      local_398.data._M_elems._24_5_ = local_358.data._M_elems._24_5_;
      local_398.data._M_elems[7]._1_3_ = local_358.data._M_elems[7]._1_3_;
      local_398.data._M_elems[2] = local_358.data._M_elems[2];
      local_398.data._M_elems[3] = local_358.data._M_elems[3];
      local_398.data._M_elems[0] = local_358.data._M_elems[0];
      local_398.data._M_elems[1] = local_358.data._M_elems[1];
      local_398.exp = local_358.exp;
      local_398.neg = local_358.neg;
      local_398.fpclass = local_358.fpclass;
      local_398.prec_elem = local_358.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_398,&local_308);
      iVar16 = *(int *)((long)(&((this->m_col).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem)->val + 1) + lVar18);
      pnVar21 = (s->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar21[iVar16].m_backend.data._M_elems + 8) =
           CONCAT35(local_398.data._M_elems[9]._1_3_,local_398.data._M_elems._32_5_);
      puVar1 = pnVar21[iVar16].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = local_398.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_398.data._M_elems[7]._1_3_,local_398.data._M_elems._24_5_);
      *(undefined8 *)&pnVar21[iVar16].m_backend.data = local_398.data._M_elems._0_8_;
      *(undefined8 *)(pnVar21[iVar16].m_backend.data._M_elems + 2) = local_398.data._M_elems._8_8_;
      pnVar21[iVar16].m_backend.exp = local_398.exp;
      pnVar21[iVar16].m_backend.neg = local_398.neg;
      pnVar21[iVar16].m_backend.fpclass = local_398.fpclass;
      pnVar21[iVar16].m_backend.prec_elem = local_398.prec_elem;
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0x3c;
    } while (lVar17 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((local_238->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar17 = 0x38;
    lVar18 = 0;
    do {
      iVar16 = *(int *)((long)(((this->m_col).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val).m_backend.data._M_elems + lVar17);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_398,
                   &(this->m_rowObj).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,iVar16);
      pnVar21 = (local_1d0->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar21[iVar16].m_backend.data._M_elems + 8) =
           CONCAT35(local_398.data._M_elems[9]._1_3_,local_398.data._M_elems._32_5_);
      puVar1 = pnVar21[iVar16].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = local_398.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_398.data._M_elems[7]._1_3_,local_398.data._M_elems._24_5_);
      *(undefined8 *)&pnVar21[iVar16].m_backend.data = local_398.data._M_elems._0_8_;
      *(undefined8 *)(pnVar21[iVar16].m_backend.data._M_elems + 2) = local_398.data._M_elems._8_8_;
      pnVar21[iVar16].m_backend.exp = local_398.exp;
      pnVar21[iVar16].m_backend.neg = local_398.neg;
      pnVar21[iVar16].m_backend.fpclass = local_398.fpclass;
      pnVar21[iVar16].m_backend.prec_elem = local_398.prec_elem;
      lVar18 = lVar18 + 1;
      iVar16 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused;
      lVar17 = lVar17 + 0x3c;
    } while (lVar18 < iVar16);
    if (0 < iVar16) {
      pVVar22 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(ulong)local_39c;
      lVar17 = 0x38;
      pVVar28 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0;
      local_318 = pVVar22;
      do {
        if (local_318 == pVVar28) {
          local_250->data[this->m_j] = BASIC;
          pNVar23 = (this->m_col).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          fVar30 = pNVar23[(long)pVVar22].val.m_backend.fpclass;
          if (this->m_loFree == true) {
            VVar25 = ON_LOWER;
            if (fVar30 != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_398,0,(type *)0x0);
              iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)(pNVar23 + (long)pVVar22),
                                  &local_398);
              bVar6 = iVar16 < 1;
LAB_003299fe:
              VVar25 = (VarStatus)bVar6;
              pNVar23 = (this->m_col).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem;
            }
          }
          else {
            VVar25 = ON_UPPER;
            if (fVar30 != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_398,0,(type *)0x0);
              iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)(pNVar23 + (long)pVVar22),
                                  &local_398);
              bVar6 = 0 < iVar16;
              goto LAB_003299fe;
            }
          }
          piVar24 = &pNVar23[(long)pVVar22].idx;
        }
        else {
          piVar24 = (int *)((long)(((this->m_col).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val).m_backend.data._M_elems + lVar17);
          VVar25 = BASIC;
        }
        rStatus->data[*piVar24] = VVar25;
        pVVar28 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)&(pVVar28->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1);
        lVar17 = lVar17 + 0x3c;
      } while ((long)pVVar28 <
               (long)(this->m_col).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused);
    }
  }
  if (local_39c == 0xffffffff) {
    local_250->data[this->m_j] = this->m_loFree ^ ON_LOWER;
  }
  local_1c8._vptr_DSVectorBase = local_240;
  if (local_1c8.theelem !=
      (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    free(local_1c8.theelem);
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeZeroObjVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   int rIdx = m_old_i - m_col.size() + 1;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int rIdx_new = m_col.index(k);
      s[rIdx] = s[rIdx_new];
      y[rIdx] = y[rIdx_new];
      rStatus[rIdx] = rStatus[rIdx_new];
      rIdx++;
   }

   // primal:
   int      domIdx = -1;
   DSVectorBase<R> slack(m_col.size());

   if(m_loFree)
   {
      R minRowUp = R(infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R           val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R up = z * scale / row[m_j];
         slack.add(k, val);

         if(up < minRowUp)
         {
            minRowUp = up;
            domIdx   = k;
         }
      }

      if(m_bnd < minRowUp)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = minRowUp;
   }
   else
   {
      R maxRowLo = R(-infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R lo = z * scale / row[m_j];
         slack.add(k, val);

         if(lo > maxRowLo)
         {
            maxRowLo = lo;
            domIdx   = k;
         }
      }

      if(m_bnd > maxRowLo)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = maxRowLo;
   }

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] = slack[k] + m_col.value(k) * x[m_j];

   // dual:
   r[m_j] = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int idx = m_col.index(k);
      y[idx] = m_rowObj[idx];
   }

   // basis:
   for(int k = 0; k < m_col.size(); ++k)
   {
      if(k != domIdx)
         rStatus[m_col.index(k)] = SPxSolverBase<R>::BASIC;

      else
      {
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

         if(m_loFree)
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_UPPER :
                                      SPxSolverBase<R>::ON_LOWER;
         else
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_LOWER :
                                      SPxSolverBase<R>::ON_UPPER;
      }
   }

   if(domIdx == -1)
   {
      if(m_loFree)
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM20 Dimension doesn't match after this step.");
   }

#endif
}